

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestOneofParsingLite::_InternalSerialize
          (TestOneofParsingLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  void *data;
  bool bVar1;
  undefined8 *puVar2;
  ulong uVar3;
  byte *pbVar4;
  uint8_t *puVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  uint32_t num;
  string_view s;
  
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 1:
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,*(int32_t *)&this->field_0,target);
    goto switchD_001ce71c_default;
  case 2:
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,*(MessageLite **)&this->field_0,
                        (int)(*(MessageLite **)&this->field_0)[1]._internal_metadata_.ptr_,target,
                        stream);
    goto switchD_001ce71c_default;
  case 3:
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar6 = (char *)*puVar2;
    sVar7 = puVar2[1];
    num = 3;
    break;
  case 4:
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar6 = (char *)*puVar2;
    sVar7 = puVar2[1];
    num = 4;
    break;
  case 5:
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar6 = (char *)*puVar2;
    sVar7 = puVar2[1];
    num = 5;
    break;
  case 6:
    target = google::protobuf::io::EpsCopyOutputStream::WriteBytes<absl::lts_20250127::Cord>
                       (stream,6,(this->field_0)._impl_.oneof_field_.oneof_bytes_cord_,target);
    goto switchD_001ce71c_default;
  case 7:
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar6 = (char *)*puVar2;
    sVar7 = puVar2[1];
    num = 7;
    break;
  case 8:
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar6 = (char *)*puVar2;
    sVar7 = puVar2[1];
    num = 8;
    break;
  case 9:
    if ((target < stream->end_) ||
       (target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target),
       (this->field_0)._impl_._oneof_case_[0] == 9)) {
      uVar3 = (ulong)*(int *)&this->field_0;
      pbVar4 = target + 1;
      *target = 'H';
      uVar8 = uVar3;
      if (0x7f < uVar3) {
        do {
          *pbVar4 = (byte)uVar8 | 0x80;
          uVar3 = uVar8 >> 7;
          pbVar4 = pbVar4 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar3;
        } while (bVar1);
      }
    }
    else {
      pbVar4 = target + 1;
      *target = 'H';
      uVar3 = 1;
    }
    *pbVar4 = (byte)uVar3;
    target = pbVar4 + 1;
  default:
    goto switchD_001ce71c_default;
  }
  s._M_str = pcVar6;
  s._M_len = sVar7;
  target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,num,s,target);
switchD_001ce71c_default:
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffe;
    data = *(void **)(uVar3 + 8);
    size = *(uint *)(uVar3 + 0x10);
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar5;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneofParsingLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneofParsingLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestOneofParsingLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  switch (this_.oneof_field_case()) {
    case kOneofInt32: {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_oneof_int32(), target);
      break;
    }
    case kOneofSubmessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          2, *this_._impl_.oneof_field_.oneof_submessage_, this_._impl_.oneof_field_.oneof_submessage_->GetCachedSize(), target,
          stream);
      break;
    }
    case kOneofString: {
      const ::std::string& _s = this_._internal_oneof_string();
      target = stream->WriteStringMaybeAliased(3, _s, target);
      break;
    }
    case kOneofBytes: {
      const ::std::string& _s = this_._internal_oneof_bytes();
      target = stream->WriteBytesMaybeAliased(4, _s, target);
      break;
    }
    case kOneofStringCord: {
      const ::std::string& _s = this_._internal_oneof_string_cord();
      target = stream->WriteStringMaybeAliased(5, _s, target);
      break;
    }
    case kOneofBytesCord: {
      target = stream->WriteBytes(6, this_._internal_oneof_bytes_cord(), target);
      break;
    }
    case kOneofStringStringPiece: {
      const ::std::string& _s = this_._internal_oneof_string_string_piece();
      target = stream->WriteStringMaybeAliased(7, _s, target);
      break;
    }
    case kOneofBytesStringPiece: {
      const ::std::string& _s = this_._internal_oneof_bytes_string_piece();
      target = stream->WriteBytesMaybeAliased(8, _s, target);
      break;
    }
    case kOneofEnum: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          9, this_._internal_oneof_enum(), target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestOneofParsingLite)
  return target;
}